

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall cs_impl::runtime_cs_ext::async_callable::operator()(async_callable *this)

{
  long in_RSI;
  
  if (*(long *)(in_RSI + 0x10) != 0) {
    (**(code **)(in_RSI + 0x18))(this,in_RSI,in_RSI + 0x28);
    return (var)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

var operator()() const noexcept
			{
				try {
					return func.call(args);
				}
				catch (const lang_error &le) {
					std::cerr << "await thread terminated after throwing an instance of runtime exception" << std::endl;
					std::cerr << "what(): " << le.what() << std::endl;
				}
				catch (const std::exception &e) {
					std::cerr << "await thread terminated after throwing an instance of exception" << std::endl;
					std::cerr << "what(): " << e.what() << std::endl;
				}
				catch (...) {
					std::cerr << "await thread terminated after throwing an instance of unknown exception" << std::endl;
				}
				return null_pointer;
			}